

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O3

void __thiscall
duckdb::roaring::ContainerCompressionState::OverrideArray
          (ContainerCompressionState *this,data_ptr_t *destination,bool nulls,idx_t count)

{
  data_ptr_t pdVar1;
  code *pcVar2;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,nulls) == 0) {
    pcVar2 = AppendToArray<false>;
  }
  else {
    pcVar2 = AppendToArray<true>;
  }
  this->append_function = pcVar2;
  pdVar1 = *destination;
  if (7 < count) {
    pdVar1[0] = '\0';
    pdVar1[1] = '\0';
    pdVar1[2] = '\0';
    pdVar1[3] = '\0';
    pdVar1[4] = '\0';
    pdVar1[5] = '\0';
    pdVar1[6] = '\0';
    pdVar1[7] = '\0';
    pdVar1 = *destination;
    this->array_counts[nulls] = pdVar1;
    this->compressed_arrays[nulls] = pdVar1 + 8;
    return;
  }
  *destination = (data_ptr_t)((ulong)(pdVar1 + 1) & 0xfffffffffffffffe);
  this->arrays[nulls] = (uint16_t *)((ulong)(pdVar1 + 1) & 0xfffffffffffffffe);
  return;
}

Assistant:

void ContainerCompressionState::OverrideArray(data_ptr_t &destination, bool nulls, idx_t count) {
	if (nulls) {
		append_function = AppendToArray<true>;
	} else {
		append_function = AppendToArray<false>;
	}

	if (count >= COMPRESSED_ARRAY_THRESHOLD) {
		memset(destination, 0, sizeof(uint8_t) * COMPRESSED_SEGMENT_COUNT);
		array_counts[nulls] = reinterpret_cast<uint8_t *>(destination);
		auto data_start = destination + sizeof(uint8_t) * COMPRESSED_SEGMENT_COUNT;
		compressed_arrays[nulls] = reinterpret_cast<uint8_t *>(data_start);
	} else {
		destination = AlignValue<sizeof(uint16_t)>(destination);
		arrays[nulls] = reinterpret_cast<uint16_t *>(destination);
	}
}